

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void test<std::vector<int,std::allocator<int>>>
               (vector<int,_std::allocator<int>_> *value,serialization_category category,
               size_t serial_size)

{
  pointer __s1;
  pointer piVar1;
  int iVar2;
  size_t __n;
  binary_istream istream;
  vector<int,_std::allocator<int>_> local_78;
  array<std::byte,_1000UL> *local_58;
  undefined1 *local_50;
  fail_flag_serialization_policy local_48 [8];
  array<std::byte,_1000UL> *local_40;
  undefined1 *local_38;
  fail_flag_serialization_policy local_30 [8];
  
  if (category != trivial_array) {
    __assert_fail("serialization_category_v<T> == category",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0xc,"void test(const T &, serialization_category, size_t) [T = std::vector<int>]"
                 );
  }
  local_58 = &buffer;
  local_50 = &_end;
  local_48[0].overflow = false;
  detail::operator<<((ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                      *)local_48,value);
  if (local_48[0].overflow == true) {
    __assert_fail("!ostream.overflow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0x10,
                  "void test(const T &, serialization_category, size_t) [T = std::vector<int>]");
  }
  if (local_58[-0x442]._M_elems + 0xc0 !=
      (undefined1 *)
      ((long)(value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish +
      (8 - (long)(value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start))) {
    __assert_fail("size == get_serialized_size(value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0x13,
                  "void test(const T &, serialization_category, size_t) [T = std::vector<int>]");
  }
  if (local_58[-0x442]._M_elems + 0xc0 != (byte *)serial_size) {
    __assert_fail("size == serial_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0x14,
                  "void test(const T &, serialization_category, size_t) [T = std::vector<int>]");
  }
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_40 = &buffer;
  local_38 = &_end;
  local_30[0].overflow = false;
  detail::operator>>((istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                      *)local_30,&local_78);
  if (local_58 != local_40) {
    __assert_fail("ostream.data() == istream.data()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0x1a,
                  "void test(const T &, serialization_category, size_t) [T = std::vector<int>]");
  }
  __s1 = (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start;
  piVar1 = (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  __n = (long)piVar1 - (long)__s1;
  if (__n == (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start) {
    if (piVar1 != __s1) {
      iVar2 = bcmp(__s1,local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,__n);
      if (iVar2 != 0) goto LAB_00102fad;
    }
    local_50 = (undefined1 *)(serial_size + 0x10a10f);
    local_58 = &buffer;
    local_48[0].overflow = false;
    detail::operator<<((ostream_mixin<basic_binary_ostream<fail_flag_serialization_policy>,_span<std::byte>,_fail_flag_serialization_policy>
                        *)local_48,value);
    if (local_48[0].overflow != false) {
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
    __assert_fail("ostream.overflow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                  ,0x1f,
                  "void test(const T &, serialization_category, size_t) [T = std::vector<int>]");
  }
LAB_00102fad:
  __assert_fail("value == value_copy",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/tests/main.cpp"
                ,0x1b,"void test(const T &, serialization_category, size_t) [T = std::vector<int>]")
  ;
}

Assistant:

void test(T const& value, serialization_category category, size_t serial_size) {
    assert(serialization_category_v<T> == category);

    auto ostream = binary_ostream{ buffer };
    ostream << value;
    assert(!ostream.overflow);

    size_t const size = ostream.data() - buffer.data();
    assert(size == get_serialized_size(value));
    assert(size == serial_size);

    auto value_copy = T{};
    auto istream = binary_istream{ buffer };
    istream >> value_copy;

    assert(ostream.data() == istream.data());
    assert(value == value_copy);

    ostream = { buffer.data(), serial_size - 1 };
    ostream << value;
    assert(ostream.overflow);
}